

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media_type.cpp
# Opt level: O2

czstring pstore::http::media_type_from_extension(czstring extension)

{
  int iVar1;
  difference_type __d;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  char *pcVar5;
  undefined **ppuVar6;
  
  lVar3 = 0x10;
  ppuVar6 = &(anonymous_namespace)::media_types;
  do {
    if (lVar3 == 0xb0) {
      uVar2 = 0xb;
      while (uVar4 = uVar2, 0 < (long)uVar4) {
        uVar2 = uVar4 >> 1;
        iVar1 = strcmp(ppuVar6[uVar2 * 2],extension);
        if (iVar1 < 0) {
          ppuVar6 = ppuVar6 + uVar2 * 2 + 2;
          uVar2 = ~uVar2 + uVar4;
        }
      }
      pcVar5 = "application/octet-stream";
      if ((ppuVar6 != (undefined **)&ws_error_category::vtable) &&
         (iVar1 = strcmp(extension,*ppuVar6), iVar1 == 0)) {
        pcVar5 = ppuVar6[1];
      }
      return pcVar5;
    }
    iVar1 = strcmp(*(char **)((long)&(anonymous_namespace)::media_types + lVar3),
                   *(char **)((long)http_date::months._M_elems + lVar3 + 0x50));
    lVar3 = lVar3 + 0x10;
  } while (-1 < iVar1);
  assert_failed("std::is_sorted ( begin, end, [] (media_type_entry const & lhs, media_type_entry const & rhs) noexcept { return std::strcmp (lhs.name, rhs.name) < 0; })"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/http/media_type.cpp"
                ,0x3a);
}

Assistant:

gsl::czstring PSTORE_NONNULL
        media_type_from_extension (gsl::czstring const PSTORE_NONNULL extension) {
            static auto const begin = std::begin (media_types);
            static auto const end = std::end (media_types);

            PSTORE_ASSERT (std::is_sorted (
                begin, end,
                [] (media_type_entry const & lhs, media_type_entry const & rhs) noexcept {
                    return std::strcmp (lhs.name, rhs.name) < 0;
                }));

            auto const pos = std::lower_bound (
                begin, end, extension,
                [] (media_type_entry const & mte, gsl::czstring const ext) noexcept {
                    return std::strcmp (mte.name, ext) < 0;
                });
            return pos != end && std::strcmp (extension, pos->name) == 0
                       ? pos->media_type
                       : "application/octet-stream";
        }